

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack16.h
# Opt level: O2

void ncnn::conv3x3s1_winograd63_transform_input_pack16_avx512
               (Mat *bottom_blob,Mat *bottom_blob_tm,Option *opt)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  int iVar4;
  size_t sVar5;
  void *pvVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 (*pauVar14) [64];
  long lVar15;
  ulong uVar16;
  int j;
  int iVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  float tmp [8] [8] [16];
  long local_1110;
  undefined1 auStack_1080 [64];
  undefined1 auStack_1040 [64];
  undefined1 auStack_1000 [64];
  undefined1 auStack_fc0 [64];
  undefined1 auStack_f80 [64];
  undefined1 auStack_f40 [64];
  undefined1 auStack_f00 [64];
  undefined1 auStack_ec0 [64];
  undefined1 auStack_e80 [512];
  undefined1 auStack_c80 [512];
  undefined1 auStack_a80 [512];
  undefined1 auStack_880 [512];
  undefined1 auStack_680 [512];
  undefined1 auStack_480 [512];
  undefined1 auStack_280 [512];
  undefined1 auStack_80 [80];
  
  iVar4 = bottom_blob->w;
  uVar8 = (long)(iVar4 + -2) / 6;
  uVar12 = (long)(bottom_blob->h + -2) / 6;
  iVar7 = (int)uVar12;
  iVar17 = (int)uVar8;
  iVar11 = iVar7 * iVar17;
  uVar16 = 0;
  uVar13 = 0;
  if (0 < iVar17) {
    uVar13 = uVar8 & 0xffffffff;
  }
  uVar8 = uVar12 & 0xffffffff;
  if (iVar7 < 1) {
    uVar8 = uVar16;
  }
  uVar12 = (ulong)(uint)bottom_blob->c;
  if (bottom_blob->c < 1) {
    uVar12 = uVar16;
  }
  auVar22 = vbroadcastss_avx512f(ZEXT416(0x40a80000));
  auVar23 = vbroadcastss_avx512f(ZEXT416(0xc0880000));
  auVar24 = vbroadcastss_avx512f(ZEXT416(0x3e800000));
  auVar25 = vbroadcastss_avx512f(ZEXT416(0xbfa00000));
  auVar26 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
  auVar27 = vbroadcastss_avx512f(ZEXT416(0xc0200000));
  auVar28 = vbroadcastss_avx512f(ZEXT416(0x40000000));
  auVar29 = vbroadcastss_avx512f(ZEXT416(0x40800000));
  for (; uVar16 != uVar12; uVar16 = uVar16 + 1) {
    iVar7 = bottom_blob->w;
    sVar5 = bottom_blob->elemsize;
    lVar15 = bottom_blob_tm->cstep * bottom_blob_tm->elemsize * uVar16;
    pvVar6 = bottom_blob_tm->data;
    local_1110 = (long)bottom_blob->data + bottom_blob->cstep * sVar5 * uVar16 + 0x1c0;
    lVar10 = 0;
    for (uVar21 = 0; uVar21 != uVar8; uVar21 = uVar21 + 1) {
      lVar9 = lVar10;
      for (uVar18 = 0; uVar18 != uVar13; uVar18 = uVar18 + 1) {
        pauVar14 = (undefined1 (*) [64])(((long)(uVar18 * 0x6000000000) >> 0x1e) + local_1110);
        for (lVar19 = -0x200; lVar19 != 0; lVar19 = lVar19 + 0x40) {
          auVar34 = pauVar14[-6];
          auVar33 = pauVar14[-5];
          auVar35 = pauVar14[-4];
          auVar1 = pauVar14[-3];
          auVar2 = pauVar14[-2];
          auVar3 = pauVar14[-1];
          auVar30 = vsubps_avx512f(auVar1,auVar33);
          auVar31 = vsubps_avx512f(pauVar14[-7],auVar3);
          auVar30 = vfmadd231ps_avx512f(auVar31,auVar22,auVar30);
          auVar31 = vsubps_avx512f(auVar35,auVar2);
          auVar32 = vsubps_avx512f(*pauVar14,auVar34);
          auVar31 = vfmadd231ps_avx512f(auVar32,auVar22,auVar31);
          *(undefined1 (*) [64])(auStack_e80 + lVar19) = auVar30;
          *(undefined1 (*) [64])(auStack_80 + lVar19) = auVar31;
          auVar30 = vaddps_avx512f(auVar3,auVar33);
          auVar30 = vfmadd231ps_avx512f(auVar30,auVar1,auVar23);
          auVar31 = vaddps_avx512f(auVar2,auVar34);
          auVar31 = vfmadd231ps_avx512f(auVar31,auVar35,auVar23);
          auVar32 = vaddps_avx512f(auVar30,auVar31);
          auVar30 = vsubps_avx512f(auVar30,auVar31);
          *(undefined1 (*) [64])(auStack_c80 + lVar19) = auVar32;
          *(undefined1 (*) [64])(auStack_a80 + lVar19) = auVar30;
          auVar30 = vfmadd231ps_avx512f(auVar3,auVar33,auVar24);
          auVar30 = vfmadd231ps_avx512f(auVar30,auVar1,auVar25);
          auVar31 = vmulps_avx512f(auVar34,auVar26);
          auVar31 = vfmadd231ps_avx512f(auVar31,auVar35,auVar27);
          auVar31 = vfmadd231ps_avx512f(auVar31,auVar2,auVar28);
          auVar32 = vaddps_avx512f(auVar30,auVar31);
          auVar30 = vsubps_avx512f(auVar30,auVar31);
          *(undefined1 (*) [64])(auStack_880 + lVar19) = auVar32;
          *(undefined1 (*) [64])(auStack_680 + lVar19) = auVar30;
          auVar33 = vfmadd213ps_avx512f(auVar1,auVar25,auVar33);
          auVar33 = vfmadd132ps_avx512f(auVar33,auVar3,auVar29);
          auVar34 = vaddps_avx512f(auVar34,auVar34);
          auVar34 = vfmadd231ps_avx512f(auVar34,auVar27,auVar35);
          auVar34 = vfmadd231ps_avx512f(auVar34,auVar26,auVar2);
          auVar35 = vaddps_avx512f(auVar33,auVar34);
          auVar34 = vsubps_avx512f(auVar33,auVar34);
          *(undefined1 (*) [64])(auStack_480 + lVar19) = auVar35;
          *(undefined1 (*) [64])(auStack_280 + lVar19) = auVar34;
          pauVar14 = (undefined1 (*) [64])(*pauVar14 + (long)(iVar4 << 4) * 4);
        }
        lVar19 = lVar9;
        for (lVar20 = 0; lVar20 != 0x1000; lVar20 = lVar20 + 0x200) {
          auVar34 = *(undefined1 (*) [64])(auStack_1040 + lVar20);
          auVar33 = *(undefined1 (*) [64])(auStack_1000 + lVar20);
          auVar35 = *(undefined1 (*) [64])(auStack_fc0 + lVar20);
          auVar1 = *(undefined1 (*) [64])(auStack_f80 + lVar20);
          auVar2 = *(undefined1 (*) [64])(auStack_f40 + lVar20);
          auVar3 = *(undefined1 (*) [64])(auStack_f00 + lVar20);
          auVar30 = vsubps_avx512f(auVar1,auVar33);
          auVar31 = vsubps_avx512f(*(undefined1 (*) [64])(auStack_1080 + lVar20),auVar3);
          auVar30 = vfmadd231ps_avx512f(auVar31,auVar22,auVar30);
          auVar31 = vsubps_avx512f(auVar35,auVar2);
          auVar32 = vsubps_avx512f(*(undefined1 (*) [64])(auStack_ec0 + lVar20),auVar34);
          auVar31 = vfmadd231ps_avx512f(auVar32,auVar22,auVar31);
          auVar32 = vaddps_avx512f(auVar3,auVar33);
          auVar32 = vfmadd231ps_avx512f(auVar32,auVar1,auVar23);
          auVar36 = vaddps_avx512f(auVar2,auVar34);
          auVar36 = vfmadd231ps_avx512f(auVar36,auVar35,auVar23);
          auVar37 = vaddps_avx512f(auVar32,auVar36);
          auVar32 = vsubps_avx512f(auVar32,auVar36);
          auVar36 = vfmadd231ps_avx512f(auVar3,auVar33,auVar24);
          auVar36 = vfmadd231ps_avx512f(auVar36,auVar1,auVar25);
          auVar38 = vmulps_avx512f(auVar34,auVar26);
          auVar38 = vfmadd231ps_avx512f(auVar38,auVar35,auVar27);
          auVar38 = vfmadd231ps_avx512f(auVar38,auVar2,auVar28);
          auVar39 = vaddps_avx512f(auVar36,auVar38);
          auVar36 = vsubps_avx512f(auVar36,auVar38);
          auVar33 = vfmadd213ps_avx512f(auVar1,auVar25,auVar33);
          auVar33 = vfmadd132ps_avx512f(auVar33,auVar3,auVar29);
          auVar34 = vaddps_avx512f(auVar34,auVar34);
          auVar34 = vfmadd231ps_avx512f(auVar34,auVar27,auVar35);
          auVar34 = vfmadd231ps_avx512f(auVar34,auVar26,auVar2);
          auVar35 = vaddps_avx512f(auVar33,auVar34);
          auVar34 = vsubps_avx512f(auVar33,auVar34);
          *(undefined1 (*) [64])((long)pvVar6 + lVar19 + lVar15) = auVar30;
          *(undefined1 (*) [64])((long)pvVar6 + lVar19 + (long)(iVar11 * 0x10) * 4 + lVar15) =
               auVar37;
          *(undefined1 (*) [64])((long)pvVar6 + lVar19 + (long)(iVar11 * 0x20) * 4 + lVar15) =
               auVar32;
          *(undefined1 (*) [64])((long)pvVar6 + lVar19 + (long)(iVar11 * 0x30) * 4 + lVar15) =
               auVar39;
          *(undefined1 (*) [64])((long)pvVar6 + lVar19 + (long)(iVar11 * 0x40) * 4 + lVar15) =
               auVar36;
          *(undefined1 (*) [64])((long)pvVar6 + lVar19 + (long)(iVar11 * 0x50) * 4 + lVar15) =
               auVar35;
          *(undefined1 (*) [64])((long)pvVar6 + lVar19 + (long)(iVar11 * 0x60) * 4 + lVar15) =
               auVar34;
          *(undefined1 (*) [64])((long)pvVar6 + lVar19 + (long)(iVar11 * 0x70) * 4 + lVar15) =
               auVar31;
          lVar19 = lVar19 + (long)(iVar11 * 0x80) * 4;
        }
        lVar9 = lVar9 + 0x40;
      }
      local_1110 = local_1110 + (long)iVar7 * sVar5 * 6;
      lVar10 = lVar10 + (long)iVar17 * 0x40;
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_input_pack16_avx512(const Mat& bottom_blob, Mat& bottom_blob_tm, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int inch = bottom_blob.c;

    const int w_tiles = (w - 2) / 6;
    const int h_tiles = (h - 2) / 6;
    const int tiles = w_tiles * h_tiles;

    // const float itm[8][8] = {
    //     {1.0f,  0.0f, -5.25f,  0.00f,  5.25f,  0.00f, -1.0f, 0.0f},
    //
    //     {0.0f,  1.0f,  1.00f, -4.25f, -4.25f,  1.00f,  1.0f, 0.0f},
    //     {0.0f, -1.0f,  1.00f,  4.25f, -4.25f, -1.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  0.5f,  0.25f, -2.50f, -1.25f,  2.00f,  1.0f, 0.0f},
    //     {0.0f, -0.5f,  0.25f,  2.50f, -1.25f, -2.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  2.0f,  4.00f, -2.50f, -5.00f,  0.50f,  1.0f, 0.0f},
    //     {0.0f, -2.0f,  4.00f,  2.50f, -5.00f, -0.50f,  1.0f, 0.0f},
    //
    //     {0.0f, -1.0f,  0.00f,  5.25f,  0.00f, -5.25f,  0.0f, 1.0f}
    // };

    // 0 = r00 - r06 + (r04 - r02) * 5.25
    // 7 = r07 - r01 + (r03 - r05) * 5.25

    // 1 = (r02 + r06 - r04 * 4.25) + (r01 - r03 * 4.25 + r05)
    // 2 = (r02 + r06 - r04 * 4.25) - (r01 - r03 * 4.25 + r05)

    // 3 = (r06 + r02 * 0.25 - r04 * 1.25) + (r01 * 0.5 - r03 * 2.5 + r05 * 2)
    // 4 = (r06 + r02 * 0.25 - r04 * 1.25) - (r01 * 0.5 - r03 * 2.5 + r05 * 2)

    // reuse r04 * 1.25
    // reuse r03 * 2.5
    // 5 = (r06 + (r02 - r04 * 1.25) * 4) + (r01 * 2 - r03 * 2.5 + r05 * 0.5)
    // 6 = (r06 + (r02 - r04 * 1.25) * 4) - (r01 * 2 - r03 * 2.5 + r05 * 0.5)

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        Mat img0_tm = bottom_blob_tm.channel(q);

#ifdef _MSC_VER
        __declspec(align(64))
#else
        __attribute__((aligned(64)))
#endif
        float tmp[8][8][16];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* r0 = img0.row(i * 6) + (j * 6) * 16;

                for (int m = 0; m < 8; m++)
                {
                    __m512 _r00 = _mm512_load_ps(r0);
                    __m512 _r01 = _mm512_load_ps(r0 + 16);
                    __m512 _r02 = _mm512_load_ps(r0 + 16 * 2);
                    __m512 _r03 = _mm512_load_ps(r0 + 16 * 3);
                    __m512 _r04 = _mm512_load_ps(r0 + 16 * 4);
                    __m512 _r05 = _mm512_load_ps(r0 + 16 * 5);
                    __m512 _r06 = _mm512_load_ps(r0 + 16 * 6);
                    __m512 _r07 = _mm512_load_ps(r0 + 16 * 7);

                    __m512 _tmp0m = _mm512_fmadd_ps(_mm512_set1_ps(5.25f), _mm512_sub_ps(_r04, _r02), _mm512_sub_ps(_r00, _r06));
                    __m512 _tmp7m = _mm512_fmadd_ps(_mm512_set1_ps(5.25f), _mm512_sub_ps(_r03, _r05), _mm512_sub_ps(_r07, _r01));
                    _mm512_store_ps(tmp[0][m], _tmp0m);
                    _mm512_store_ps(tmp[7][m], _tmp7m);

                    __m512 _tmp12a = _mm512_fmadd_ps(_mm512_set1_ps(-4.25f), _r04, _mm512_add_ps(_r02, _r06));
                    __m512 _tmp12b = _mm512_fmadd_ps(_mm512_set1_ps(-4.25f), _r03, _mm512_add_ps(_r01, _r05));

                    __m512 _tmp1m = _mm512_add_ps(_tmp12a, _tmp12b);
                    __m512 _tmp2m = _mm512_sub_ps(_tmp12a, _tmp12b);
                    _mm512_store_ps(tmp[1][m], _tmp1m);
                    _mm512_store_ps(tmp[2][m], _tmp2m);

                    __m512 _tmp34a = _mm512_fmadd_ps(_mm512_set1_ps(-1.25f), _r04, _mm512_fmadd_ps(_mm512_set1_ps(0.25f), _r02, _r06));
                    __m512 _tmp34b = _mm512_fmadd_ps(_mm512_set1_ps(2.f), _r05, _mm512_fmadd_ps(_mm512_set1_ps(-2.5f), _r03, _mm512_mul_ps(_r01, _mm512_set1_ps(0.5f))));

                    __m512 _tmp3m = _mm512_add_ps(_tmp34a, _tmp34b);
                    __m512 _tmp4m = _mm512_sub_ps(_tmp34a, _tmp34b);
                    _mm512_store_ps(tmp[3][m], _tmp3m);
                    _mm512_store_ps(tmp[4][m], _tmp4m);

                    __m512 _tmp56a = _mm512_fmadd_ps(_mm512_set1_ps(4.f), _mm512_fmadd_ps(_mm512_set1_ps(-1.25f), _r04, _r02), _r06);
                    __m512 _tmp56b = _mm512_fmadd_ps(_mm512_set1_ps(0.5f), _r05, _mm512_fmadd_ps(_mm512_set1_ps(-2.5f), _r03, _mm512_mul_ps(_r01, _mm512_set1_ps(2.f))));

                    __m512 _tmp5m = _mm512_add_ps(_tmp56a, _tmp56b);
                    __m512 _tmp6m = _mm512_sub_ps(_tmp56a, _tmp56b);
                    _mm512_store_ps(tmp[5][m], _tmp5m);
                    _mm512_store_ps(tmp[6][m], _tmp6m);

                    r0 += w * 16;
                }

                float* r0_tm_0 = (float*)img0_tm + (i * w_tiles + j) * 16;
                float* r0_tm_1 = r0_tm_0 + tiles * 16;
                float* r0_tm_2 = r0_tm_0 + tiles * 16 * 2;
                float* r0_tm_3 = r0_tm_0 + tiles * 16 * 3;
                float* r0_tm_4 = r0_tm_0 + tiles * 16 * 4;
                float* r0_tm_5 = r0_tm_0 + tiles * 16 * 5;
                float* r0_tm_6 = r0_tm_0 + tiles * 16 * 6;
                float* r0_tm_7 = r0_tm_0 + tiles * 16 * 7;

                for (int m = 0; m < 8; m++)
                {
                    __m512 _tmp00 = _mm512_load_ps(tmp[m][0]);
                    __m512 _tmp01 = _mm512_load_ps(tmp[m][1]);
                    __m512 _tmp02 = _mm512_load_ps(tmp[m][2]);
                    __m512 _tmp03 = _mm512_load_ps(tmp[m][3]);
                    __m512 _tmp04 = _mm512_load_ps(tmp[m][4]);
                    __m512 _tmp05 = _mm512_load_ps(tmp[m][5]);
                    __m512 _tmp06 = _mm512_load_ps(tmp[m][6]);
                    __m512 _tmp07 = _mm512_load_ps(tmp[m][7]);

                    __m512 _r0tm0 = _mm512_fmadd_ps(_mm512_set1_ps(5.25f), _mm512_sub_ps(_tmp04, _tmp02), _mm512_sub_ps(_tmp00, _tmp06));
                    __m512 _r0tm7 = _mm512_fmadd_ps(_mm512_set1_ps(5.25f), _mm512_sub_ps(_tmp03, _tmp05), _mm512_sub_ps(_tmp07, _tmp01));

                    __m512 _tmp12a = _mm512_fmadd_ps(_mm512_set1_ps(-4.25f), _tmp04, _mm512_add_ps(_tmp02, _tmp06));
                    __m512 _tmp12b = _mm512_fmadd_ps(_mm512_set1_ps(-4.25f), _tmp03, _mm512_add_ps(_tmp01, _tmp05));

                    __m512 _r0tm1 = _mm512_add_ps(_tmp12a, _tmp12b);
                    __m512 _r0tm2 = _mm512_sub_ps(_tmp12a, _tmp12b);

                    __m512 _tmp34a = _mm512_fmadd_ps(_mm512_set1_ps(-1.25f), _tmp04, _mm512_fmadd_ps(_mm512_set1_ps(0.25f), _tmp02, _tmp06));
                    __m512 _tmp34b = _mm512_fmadd_ps(_mm512_set1_ps(2.f), _tmp05, _mm512_fmadd_ps(_mm512_set1_ps(-2.5f), _tmp03, _mm512_mul_ps(_tmp01, _mm512_set1_ps(0.5f))));

                    __m512 _r0tm3 = _mm512_add_ps(_tmp34a, _tmp34b);
                    __m512 _r0tm4 = _mm512_sub_ps(_tmp34a, _tmp34b);

                    __m512 _tmp56a = _mm512_fmadd_ps(_mm512_set1_ps(4.f), _mm512_fmadd_ps(_mm512_set1_ps(-1.25f), _tmp04, _tmp02), _tmp06);
                    __m512 _tmp56b = _mm512_fmadd_ps(_mm512_set1_ps(0.5f), _tmp05, _mm512_fmadd_ps(_mm512_set1_ps(-2.5f), _tmp03, _mm512_mul_ps(_tmp01, _mm512_set1_ps(2.f))));

                    __m512 _r0tm5 = _mm512_add_ps(_tmp56a, _tmp56b);
                    __m512 _r0tm6 = _mm512_sub_ps(_tmp56a, _tmp56b);

                    _mm512_store_ps(r0_tm_0, _r0tm0);
                    _mm512_store_ps(r0_tm_1, _r0tm1);
                    _mm512_store_ps(r0_tm_2, _r0tm2);
                    _mm512_store_ps(r0_tm_3, _r0tm3);
                    _mm512_store_ps(r0_tm_4, _r0tm4);
                    _mm512_store_ps(r0_tm_5, _r0tm5);
                    _mm512_store_ps(r0_tm_6, _r0tm6);
                    _mm512_store_ps(r0_tm_7, _r0tm7);

                    r0_tm_0 += tiles * 128;
                    r0_tm_1 += tiles * 128;
                    r0_tm_2 += tiles * 128;
                    r0_tm_3 += tiles * 128;
                    r0_tm_4 += tiles * 128;
                    r0_tm_5 += tiles * 128;
                    r0_tm_6 += tiles * 128;
                    r0_tm_7 += tiles * 128;
                }
            }
        }
    }
}